

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O1

void aiReleaseExportFormatDescription(aiExportFormatDesc *desc)

{
  if (desc != (aiExportFormatDesc *)0x0) {
    if (desc->description != (char *)0x0) {
      operator_delete__(desc->description);
    }
    if (desc->fileExtension != (char *)0x0) {
      operator_delete__(desc->fileExtension);
    }
    if (desc->id != (char *)0x0) {
      operator_delete__(desc->id);
    }
    operator_delete(desc,0x18);
    return;
  }
  return;
}

Assistant:

ASSIMP_API void aiReleaseExportFormatDescription( const aiExportFormatDesc *desc ) {
    if (NULL == desc) {
        return;
    }

    delete [] desc->description;
    delete [] desc->fileExtension;
    delete [] desc->id;
    delete desc;
}